

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::parse_some
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  pointer pcVar4;
  m_columns_filter<char,_std::allocator<char>_> *visitor_00;
  byte bVar5;
  bool bVar6;
  csv_parse_state cVar7;
  char *pcVar8;
  byte bVar9;
  csv_errc __args;
  char cVar10;
  csv_mode local_40 [2];
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *local_38;
  
  visitor_00 = (m_columns_filter<char,_std::allocator<char>_> *)visitor;
  if (this->mapping_kind_ == m_columns) {
    this->cursor_mode_ = false;
    visitor_00 = &this->m_columns_filter_;
  }
  pcVar3 = this->input_end_;
  if ((this->input_ptr_ != pcVar3) || (this->more_ != true)) goto LAB_002666c2;
  cVar7 = this->state_;
  if (before_last_unquoted_field_tail < cVar7) {
    if (cVar7 == before_last_quoted_field) {
      end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      goto LAB_002666b6;
    }
    goto switchD_0026659c_caseD_1;
  }
  switch(cVar7) {
  case start:
    __args = source_error;
    goto LAB_002670fd;
  default:
    goto switchD_0026659c_caseD_1;
  case end_record:
    if (this->column_index_ != 0) {
      end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    }
    this->state_ = no_more_records;
    break;
  case no_more_records:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4[-1] - header < 2) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
    }
    (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(visitor_00,this,ec);
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    iVar2 = this->level_;
    if (this->mapping_kind_ == m_columns) {
      this->level_ = iVar2 + -1;
      if ((this->m_columns_filter_).state_ != done) {
        bVar6 = detail::m_columns_filter<char,_std::allocator<char>_>::replay_parse_events
                          (&this->m_columns_filter_,visitor,this->actual_cursor_mode_,
                           this->mark_level_);
        this->more_ = bVar6;
        break;
      }
    }
    else {
      if (iVar2 == this->mark_level_) {
        this->more_ = false;
      }
      this->level_ = iVar2 + -1;
    }
    this->state_ = accept;
    break;
  case unquoted_string:
    goto switchD_0026659c_caseD_9;
  case before_unquoted_string:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
switchD_0026659c_caseD_9:
    bVar6 = this->trim_leading_;
    if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
      trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
    }
    if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
    goto switchD_0026659c_caseD_1;
    before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_unquoted_field;
    break;
  case escaped_value:
    if (this->quote_escape_char_ == this->quote_char_) {
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto switchD_0026659c_caseD_1;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->column_ = this->column_ + 1;
      this->state_ = before_last_quoted_field;
      break;
    }
LAB_00267097:
    __args = invalid_escaped_char;
    goto LAB_002670fd;
  case accept:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)pcVar4 -
         (long)(this->stack_).
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start == 4) && (pcVar4[-1] == initial)) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[2])(visitor_00);
      this->state_ = done;
      goto LAB_00267102;
    }
    __args = unexpected_eof;
LAB_002670eb:
    std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::operator()
              (&this->err_handler_,__args,&this->super_ser_context);
LAB_002670fd:
    std::error_code::operator=(ec,__args);
LAB_00267102:
    this->more_ = false;
    return;
  case before_unquoted_field:
  case before_last_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_unquoted_field_tail;
    break;
  case before_last_unquoted_field_tail:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if ((this->mapping_kind_ != m_columns) && (this->level_ == this->mark_level_)) {
        this->more_ = false;
      }
      this->level_ = this->level_ + -1;
    }
LAB_002666b6:
    this->column_index_ = this->column_index_ + 1;
    goto switchD_0026659c_caseD_1;
  }
LAB_002666c2:
  cVar10 = (char)this + -0x38;
  local_38 = &this->stack_;
LAB_002666e8:
  pcVar8 = this->input_ptr_;
  if (pcVar3 <= pcVar8) {
    return;
  }
  if (this->more_ != true) {
    return;
  }
  if (before_last_quoted_field_tail < this->state_) {
switchD_0026671a_caseD_5:
    __args = invalid_parse_state;
    goto LAB_002670eb;
  }
  cVar1 = *pcVar8;
  switch(this->state_) {
  case start:
    if (this->mapping_kind_ != m_columns) {
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
      if (((this->assume_header_ == true) && (this->mapping_kind_ == n_rows)) &&
         ((this->column_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->column_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        this->column_index_ = 0;
        (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                  (visitor_00,0,this,ec);
        this->level_ = this->level_ + 1;
        this->more_ = (bool)(this->cursor_mode_ ^ 1);
      }
    }
    this->state_ = expect_comment_or_record;
    break;
  case cr:
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    if (*pcVar8 == '\n') {
      this->input_ptr_ = pcVar8 + 1;
    }
    cVar7 = pop_state(this);
    this->state_ = cVar7;
    break;
  case expect_comment_or_record:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
    if (cVar1 != this->comment_starter_) {
      this->state_ = expect_record;
      break;
    }
    this->state_ = comment;
    goto LAB_00266f68;
  case expect_record:
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      if (this->trim_leading_ == false) {
        std::__cxx11::string::push_back(cVar10);
        begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
        this->state_ = unquoted_string;
LAB_00266de7:
        pcVar8 = this->input_ptr_;
      }
      goto LAB_00266dee;
    }
    if (cVar1 == '\r') {
      if (this->ignore_empty_lines_ != false) {
        this->input_ptr_ = pcVar8 + 1;
        push_state(this,expect_record);
        this->state_ = cr;
        break;
      }
    }
    else {
      if (cVar1 != '\n') {
        begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
        if (cVar1 == this->quote_char_) {
LAB_00266f4e:
          (this->buffer_)._M_string_length = 0;
          *(this->buffer_)._M_dataplus._M_p = '\0';
          goto LAB_00266f60;
        }
        goto LAB_00266b01;
      }
      if (this->ignore_empty_lines_ != false) {
        this->line_ = this->line_ + 1;
        goto LAB_00266b3a;
      }
    }
    begin_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_0026677f;
  case end_record:
    if ((cVar1 == '\t') || (cVar1 == ' ')) goto LAB_00266dee;
    if (cVar1 == '\r') {
      this->line_ = this->line_ + 1;
      this->column_ = 1;
      this->state_ = expect_comment_or_record;
      end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
      push_state(this,this->state_);
      this->state_ = cr;
      goto LAB_00266f6c;
    }
    if (cVar1 != '\n') {
      __args = syntax_error;
      goto LAB_002670eb;
    }
    this->line_ = this->line_ + 1;
    this->column_ = 1;
    this->state_ = expect_comment_or_record;
    end_record(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_00266f6c;
  default:
    goto switchD_0026671a_caseD_5;
  case comment:
    if (cVar1 == '\r') {
      this->line_ = this->line_ + 1;
      if ((this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == header) {
        this->header_line_offset_ = this->header_line_offset_ + 1;
      }
      this->column_ = 1;
      this->state_ = expect_comment_or_record;
      push_state(this,expect_comment_or_record);
      this->state_ = cr;
      pcVar8 = this->input_ptr_;
    }
    else {
      if (cVar1 != '\n') goto LAB_00266dee;
      this->line_ = this->line_ + 1;
      if ((this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == header) {
        this->header_line_offset_ = this->header_line_offset_ + 1;
      }
LAB_00266b3a:
      this->column_ = 1;
      this->state_ = expect_comment_or_record;
    }
    goto LAB_00266df2;
  case between_values:
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto LAB_0026677f;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_last_quoted_field;
    }
    else if (cVar1 == this->field_delimiter_) {
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_quoted_field;
    }
    else {
      if ((this->subfield_delimiter_ == '\0') || (cVar1 != this->subfield_delimiter_)) {
        if ((cVar1 == ' ') || (cVar1 == '\t')) goto LAB_00266dee;
        __args = unexpected_char_between_fields;
        goto LAB_002670fd;
      }
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_quoted_subfield;
    }
    break;
  case quoted_string:
    if (cVar1 == this->quote_escape_char_) {
      this->state_ = escaped_value;
    }
    else {
      if (cVar1 != this->quote_char_) {
        std::__cxx11::string::push_back(cVar10);
        goto LAB_00266de7;
      }
      this->state_ = between_values;
    }
    goto LAB_00266dee;
  case unquoted_string:
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0))
      goto LAB_0026677f;
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_last_unquoted_field;
    }
    else if (cVar1 == this->field_delimiter_) {
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_unquoted_field;
    }
    else {
      if ((this->subfield_delimiter_ == '\0') || (cVar1 != this->subfield_delimiter_)) {
        if (cVar1 == this->quote_char_) goto LAB_00266f4e;
        std::__cxx11::string::push_back(cVar10);
        goto LAB_00266f68;
      }
      bVar6 = this->trim_leading_;
      if (((bVar6 | this->trim_trailing_) & 1U) != 0) {
        trim_string_buffer(this,bVar6,(bool)((~bVar6 | this->trim_trailing_) & 1));
      }
      before_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
      this->state_ = before_unquoted_subfield;
    }
    break;
  case before_unquoted_string:
    (this->buffer_)._M_string_length = 0;
    *(this->buffer_)._M_dataplus._M_p = '\0';
LAB_00266b01:
    this->state_ = unquoted_string;
    break;
  case escaped_value:
    if (cVar1 == this->quote_char_) {
      std::__cxx11::string::push_back(cVar10);
LAB_00266f60:
      this->state_ = quoted_string;
      goto LAB_00266f68;
    }
    if (this->quote_escape_char_ != this->quote_char_) goto LAB_00267097;
    this->state_ = between_values;
    break;
  case before_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_002669af;
  case before_unquoted_field_tail:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar5 = this->cursor_mode_ ^ 1;
      bVar9 = bVar5;
      if (this->level_ == this->mark_level_) {
        bVar9 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar9 = bVar5;
      }
      this->more_ = (bool)bVar9;
      this->level_ = this->level_ + -1;
      pcVar8 = this->input_ptr_;
    }
    this->column_index_ = this->column_index_ + 1;
    this->state_ = before_unquoted_string;
    goto LAB_00266dee;
  case before_unquoted_field_tail1:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar5 = this->cursor_mode_ ^ 1;
      bVar9 = bVar5;
      if (this->level_ == this->mark_level_) {
        bVar9 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar9 = bVar5;
      }
      this->more_ = (bool)bVar9;
      this->level_ = this->level_ + -1;
      pcVar8 = this->input_ptr_;
    }
    this->state_ = end_record;
LAB_00266dee:
    this->column_ = this->column_ + 1;
LAB_00266df2:
    this->input_ptr_ = pcVar8 + 1;
    break;
  case before_last_unquoted_field:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_unquoted_field_tail;
    break;
  case before_last_unquoted_field_tail:
  case before_last_quoted_field_tail:
    pcVar4 = (this->stack_).
             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar4[-1] == subfields) {
      (this->stack_).
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4 + -1;
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])
                (visitor_00,this,ec);
      bVar5 = this->cursor_mode_ ^ 1;
      bVar9 = bVar5;
      if (this->level_ == this->mark_level_) {
        bVar9 = 0;
      }
      if (this->mapping_kind_ == m_columns) {
        bVar9 = bVar5;
      }
      this->more_ = (bool)bVar9;
      this->level_ = this->level_ + -1;
    }
    this->column_index_ = this->column_index_ + 1;
LAB_0026677f:
    this->state_ = end_record;
    break;
  case before_unquoted_subfield:
    if ((this->stack_).
        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1] == data) {
      local_40[1] = 3;
      std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
      emplace_back<jsoncons::csv::csv_mode>(local_38,local_40 + 1);
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
    }
    this->state_ = before_unquoted_subfield_tail;
    break;
  case before_unquoted_subfield_tail:
    end_unquoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    goto LAB_002667c3;
  case before_quoted_subfield:
    if ((this->stack_).
        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1] == data) {
      local_40[0] = subfields;
      std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::
      emplace_back<jsoncons::csv::csv_mode>(local_38,local_40);
      (*(visitor_00->super_basic_json_visitor<char>)._vptr_basic_json_visitor[6])
                (visitor_00,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      this->level_ = this->level_ + 1;
    }
    this->state_ = before_quoted_subfield_tail;
    break;
  case before_quoted_subfield_tail:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002667c3:
    this->state_ = before_unquoted_string;
LAB_00266f68:
    this->column_ = this->column_ + 1;
LAB_00266f6c:
    this->input_ptr_ = this->input_ptr_ + 1;
    break;
  case before_quoted_field:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
LAB_002669af:
    this->state_ = before_unquoted_field_tail;
    break;
  case before_last_quoted_field:
    end_quoted_string_value(this,&visitor_00->super_basic_json_visitor<char>,ec);
    this->state_ = before_last_quoted_field_tail;
  }
  if (this->max_lines_ < this->line_) {
    this->state_ = done;
    this->more_ = false;
  }
  goto LAB_002666e8;
switchD_0026659c_caseD_1:
  this->state_ = end_record;
  goto LAB_002666c2;
}

Assistant:

void parse_some(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        basic_json_visitor<CharT>& local_visitor = (mapping_kind_ == csv_mapping_kind::m_columns) 
            ? m_columns_filter_ : visitor;

        switch (mapping_kind_)
        {
            case csv_mapping_kind::m_columns:
                cursor_mode_ = false;
                break;
            default:
                break;
        } 

        const CharT* local_input_end = input_end_;

        if (input_ptr_ == local_input_end && more_)
        {
            switch (state_)
            {
                case csv_parse_state::start:
                    ec = csv_errc::source_error;
                    more_ = false;
                    return;
                case csv_parse_state::before_unquoted_field:
                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;
                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::before_unquoted_string: 
                    buffer_.clear();
                    JSONCONS_FALLTHROUGH;
                case csv_parse_state::unquoted_string: 
                    if (trim_leading_ || trim_trailing_)
                    {
                        trim_string_buffer(trim_leading_,trim_trailing_);
                    }
                    if (ignore_empty_values_ && buffer_.empty())
                    {
                        state_ = csv_parse_state::end_record;
                    }
                    else
                    {
                        before_value(local_visitor, ec);
                        state_ = csv_parse_state::before_unquoted_field;
                    }
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::escaped_value:
                    if (quote_escape_char_ == quote_char_)
                    {
                        if (!(ignore_empty_values_ && buffer_.empty()))
                        {
                            before_value(local_visitor, ec);
                            ++column_;
                            state_ = csv_parse_state::before_last_quoted_field;
                        }
                        else
                        {
                            state_ = csv_parse_state::end_record;
                        }
                    }
                    else
                    {
                        ec = csv_errc::invalid_escaped_char;
                        more_ = false;
                        return;
                    }
                    break;
                case csv_parse_state::end_record:
                    if (column_index_ > 0)
                    {
                        end_record(local_visitor, ec);
                    }
                    state_ = csv_parse_state::no_more_records;
                    break;
                case csv_parse_state::no_more_records: 
                    switch (stack_.back()) 
                    {
                        case csv_mode::header:
                            stack_.pop_back();
                            break;
                        case csv_mode::data:
                            stack_.pop_back();
                            break;
                        default:
                            break;
                    }
                    local_visitor.end_array(*this, ec);
                    more_ = !cursor_mode_;
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        if (level() == mark_level_)
                        {
                            more_ = false;
                        }
                    }
                    --level_;
                    
                    if (mapping_kind_ == csv_mapping_kind::m_columns)
                    {
                        if (!m_columns_filter_.done())
                        {
                            more_ = m_columns_filter_.replay_parse_events(visitor, actual_cursor_mode_, mark_level_);
                        }
                        else
                        {
                            state_ = csv_parse_state::accept;
                        }
                    }
                    else
                    {
                        state_ = csv_parse_state::accept;
                    }
                    break;
                case csv_parse_state::accept:
                    if (!(stack_.size() == 1 && stack_.back() == csv_mode::initial))
                    {
                        err_handler_(csv_errc::unexpected_eof, *this);
                        ec = csv_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    stack_.pop_back();
                    local_visitor.flush();
                    state_ = csv_parse_state::done;
                    more_ = false;
                    return;
                default:
                    state_ = csv_parse_state::end_record;
                    break;
            }
        }

        for (; (input_ptr_ < local_input_end) && more_;)
        {
            CharT curr_char = *input_ptr_;

            switch (state_) 
            {
                case csv_parse_state::cr:
                    ++line_;
                    column_ = 1;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            state_ = pop_state();
                            break;
                        default:
                            state_ = pop_state();
                            break;
                    }
                    break;
                case csv_parse_state::start:
                    if (mapping_kind_ != csv_mapping_kind::m_columns)
                    {
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows && !column_names_.empty())
                    {
                        column_index_ = 0; 
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        ++level_;
                        more_ = !cursor_mode_;
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_comment_or_record;
                    }
                    break;
                case csv_parse_state::comment: 
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            break;
                        }
                        case '\r':
                            ++line_;
                            if (stack_.back() == csv_mode::header)
                            {
                                ++header_line_offset_;
                            }
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            break;
                        default:
                            ++column_;
                            break;
                    }
                    ++input_ptr_;
                    break;
                
                case csv_parse_state::expect_comment_or_record:
                    buffer_.clear();
                    if (curr_char == comment_starter_)
                    {
                        state_ = csv_parse_state::comment;
                        ++column_;
                        ++input_ptr_;
                    }
                    else
                    {
                        state_ = csv_parse_state::expect_record;
                    }
                    break;
                case csv_parse_state::quoted_string: 
                    {
                        if (curr_char == quote_escape_char_)
                        {
                            state_ = csv_parse_state::escaped_value;
                        }
                        else if (curr_char == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                        }
                    }
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::escaped_value: 
                    {
                        if (curr_char == quote_char_)
                        {
                            buffer_.push_back(static_cast<CharT>(curr_char));
                            state_ = csv_parse_state::quoted_string;
                            ++column_;
                            ++input_ptr_;
                        }
                        else if (quote_escape_char_ == quote_char_)
                        {
                            state_ = csv_parse_state::between_values;
                        }
                        else
                        {
                            ec = csv_errc::invalid_escaped_char;
                            more_ = false;
                            return;
                        }
                    }
                    break;
                case csv_parse_state::between_values:
                    switch (curr_char)
                    {
                        case '\r':
                        case '\n':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_quoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_quoted_subfield;
                            }
                            else if (curr_char == ' ' || curr_char == '\t')
                            {
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                ec = csv_errc::unexpected_char_between_fields;
                                more_ = false;
                                return;
                            }
                            break;
                    }
                    break;
                case csv_parse_state::before_unquoted_string: 
                {
                    buffer_.clear();
                    state_ = csv_parse_state::unquoted_string;
                    break;
                }
                case csv_parse_state::before_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail;
                    break;
                case csv_parse_state::before_unquoted_field_tail:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                }
                case csv_parse_state::before_unquoted_field_tail1:
                {
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    state_ = csv_parse_state::end_record;
                    ++column_;
                    ++input_ptr_;
                    break;
                }

                case csv_parse_state::before_last_unquoted_field:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_unquoted_field_tail;
                    break;

                case csv_parse_state::before_last_unquoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;

                case csv_parse_state::before_unquoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_unquoted_subfield_tail;
                    break; 
                case csv_parse_state::before_unquoted_subfield_tail:
                    end_unquoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_field_tail; // return to unquoted
                    break;
                case csv_parse_state::before_quoted_subfield:
                    if (stack_.back() == csv_mode::data)
                    {
                        stack_.push_back(csv_mode::subfields);
                        local_visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                    }
                    state_ = csv_parse_state::before_quoted_subfield_tail;
                    break; 
                case csv_parse_state::before_quoted_subfield_tail:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_unquoted_string;
                    ++column_;
                    ++input_ptr_;
                    break;
                case csv_parse_state::before_last_quoted_field:
                    end_quoted_string_value(local_visitor, ec);
                    state_ = csv_parse_state::before_last_quoted_field_tail;
                    break;
                case csv_parse_state::before_last_quoted_field_tail:
                    if (stack_.back() == csv_mode::subfields)
                    {
                        stack_.pop_back();
                        local_visitor.end_array(*this, ec);
                        more_ = !cursor_mode_;
                        if (mapping_kind_ != csv_mapping_kind::m_columns)
                        {
                            if (level() == mark_level_)
                            {
                                more_ = false;
                            }
                        }
                        --level_;
                    }
                    ++column_index_;
                    state_ = csv_parse_state::end_record;
                    break;
                case csv_parse_state::unquoted_string: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        case '\r':
                        {
                            if (trim_leading_ || trim_trailing_)
                            {
                                trim_string_buffer(trim_leading_,trim_trailing_);
                            }
                            if (!(ignore_empty_values_ && buffer_.empty()))
                            {
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_last_unquoted_field;
                            }
                            else
                            {
                                state_ = csv_parse_state::end_record;
                            }
                            break;
                        }
                        default:
                            if (curr_char == field_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_field;
                            }
                            else if (subfield_delimiter_ != char_type() && curr_char == subfield_delimiter_)
                            {
                                if (trim_leading_ || trim_trailing_)
                                {
                                    trim_string_buffer(trim_leading_,trim_trailing_);
                                }
                                before_value(local_visitor, ec);
                                state_ = csv_parse_state::before_unquoted_subfield;
                            }
                            else if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                ++column_;
                                ++input_ptr_;
                            }
                            break;
                    }
                    break;
                }
                case csv_parse_state::expect_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++line_;
                                column_ = 1;
                                state_ = csv_parse_state::expect_comment_or_record;
                                ++input_ptr_;
                            }
                            break;
                        }
                        case '\r':
                            if (!ignore_empty_lines_)
                            {
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::end_record;
                            }
                            else
                            {
                                ++input_ptr_;
                                push_state(state_);
                                state_ = csv_parse_state::cr;
                            }
                            break;
                        case ' ':
                        case '\t':
                            if (!trim_leading_)
                            {
                                buffer_.push_back(static_cast<CharT>(curr_char));
                                begin_record(local_visitor, ec);
                                state_ = csv_parse_state::unquoted_string;
                            }
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            begin_record(local_visitor, ec);
                            if (curr_char == quote_char_)
                            {
                                buffer_.clear();
                                state_ = csv_parse_state::quoted_string;
                                ++column_;
                                ++input_ptr_;
                            }
                            else
                            {
                                state_ = csv_parse_state::unquoted_string;
                            }
                            break;
                        }
                    break;
                    }
                case csv_parse_state::end_record: 
                {
                    switch (curr_char)
                    {
                        case '\n':
                        {
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            ++input_ptr_;
                            break;
                        }
                        case '\r':
                            ++line_;
                            column_ = 1;
                            state_ = csv_parse_state::expect_comment_or_record;
                            end_record(local_visitor, ec);
                            push_state(state_);
                            state_ = csv_parse_state::cr;
                            ++input_ptr_;
                            break;
                        case ' ':
                        case '\t':
                            ++column_;
                            ++input_ptr_;
                            break;
                        default:
                            err_handler_(csv_errc::syntax_error, *this);
                            ec = csv_errc::syntax_error;
                            more_ = false;
                            return;
                        }
                    break;
                }
                default:
                    err_handler_(csv_errc::invalid_parse_state, *this);
                    ec = csv_errc::invalid_parse_state;
                    more_ = false;
                    return;
            }
            if (line_ > max_lines_)
            {
                state_ = csv_parse_state::done;
                more_ = false;
            }
        }
    }